

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O0

void __thiscall
Kernel::DisagreementSetIterator::DisagreementSetIterator
          (DisagreementSetIterator *this,Term *t1,Term *t2,bool disjunctVariables)

{
  byte in_CL;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *in_RDI;
  bool in_stack_0000000f;
  Term *in_stack_00000010;
  Term *in_stack_00000018;
  DisagreementSetIterator *in_stack_00000020;
  Stack<Kernel::TermList_*> *in_stack_ffffffffffffffd0;
  
  Lib::IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>::IteratorCore(in_RDI);
  in_RDI->_vptr_IteratorCore = (_func_int **)&PTR__DisagreementSetIterator_01320778;
  Lib::Stack<Kernel::TermList_*>::Stack(in_stack_ffffffffffffffd0,(size_t)(in_RDI + 1));
  *(byte *)&in_RDI[3]._vptr_IteratorCore = in_CL & 1;
  TermList::TermList((TermList *)&in_RDI[3]._refCnt);
  TermList::TermList((TermList *)(in_RDI + 4));
  reset(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f);
  return;
}

Assistant:

DisagreementSetIterator(Term* t1, Term* t2, bool disjunctVariables=true)
  : _stack(8), _disjunctVariables(disjunctVariables)
  {
    reset(t1,t2,disjunctVariables);
  }